

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float64 float64_muladd_m68k(float64 xa,float64 xb,float64 xc,int flags,float_status *s)

{
  int iVar1;
  float64 fVar2;
  double dVar3;
  double __z;
  union_float64 uc;
  union_float64 ub;
  union_float64 ua;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_60 = (double)xc;
  local_58 = (double)xb;
  local_50 = (double)xa;
  if ((((s->float_exception_flags & 0x20) != 0) && ((flags & 8U) == 0)) &&
     (s->float_rounding_mode == '\0')) {
    if (s->flush_inputs_to_zero != '\0') {
      float64_input_flush__nocheck((float64 *)&local_50,s);
      float64_input_flush__nocheck((float64 *)&local_58,s);
      float64_input_flush__nocheck((float64 *)&local_60,s);
    }
    xa = (float64)local_50;
    xb = (float64)local_58;
    xc = (float64)local_60;
    uStack_40 = 0;
    local_48 = local_50;
    iVar1 = __fpclassify(local_50);
    if ((((iVar1 == 4) || (iVar1 == 2)) &&
        ((iVar1 = __fpclassify((double)xb), iVar1 == 4 || (iVar1 == 2)))) &&
       ((iVar1 = __fpclassify((double)xc), iVar1 == 4 || (iVar1 == 2)))) {
      if (ABS((double)xb) == 0.0 || ABS((double)xa) == 0.0) {
        if ((flags & 1U) != 0) {
          xc = xc ^ (ulong)DAT_00b66fe0;
        }
        if (SUB41((flags & 2U) >> 1,0) == (long)(xb ^ xa) < 0) {
          dVar3 = 0.0;
        }
        else {
          dVar3 = -0.0;
        }
        dVar3 = dVar3 + (double)xc;
      }
      else {
        dVar3 = local_48;
        if ((flags & 2U) != 0) {
          dVar3 = -local_48;
        }
        __z = (double)xc;
        if ((flags & 1U) != 0) {
          __z = -(double)xc;
        }
        dVar3 = fma(dVar3,(double)xb,__z);
        if (ABS(dVar3) == INFINITY) {
          s->float_exception_flags = s->float_exception_flags | 8;
        }
        else if ((double)((ulong)dVar3 & (ulong)DAT_00b66fc0) <= 1.1754943508222875e-38)
        goto LAB_00649c1e;
      }
      if ((flags & 4U) != 0) {
        dVar3 = (double)((ulong)dVar3 ^ (ulong)DAT_00b66fe0);
      }
      return (float64)dVar3;
    }
  }
LAB_00649c1e:
  fVar2 = soft_f64_muladd(xa,xb,xc,flags,s);
  return fVar2;
}

Assistant:

float64 QEMU_FLATTEN
float64_muladd(float64 xa, float64 xb, float64 xc, int flags, float_status *s)
{
    union_float64 ua, ub, uc, ur;

    ua.s = xa;
    ub.s = xb;
    uc.s = xc;

    if (unlikely(!can_use_fpu(s))) {
        goto soft;
    }
    if (unlikely(flags & float_muladd_halve_result)) {
        goto soft;
    }

    float64_input_flush3(&ua.s, &ub.s, &uc.s, s);
    if (unlikely(!f64_is_zon3(ua, ub, uc))) {
        goto soft;
    }

    if (unlikely(force_soft_fma)) {
        goto soft;
    }

    /*
     * When (a || b) == 0, there's no need to check for under/over flow,
     * since we know the addend is (normal || 0) and the product is 0.
     */
    if (float64_is_zero(ua.s) || float64_is_zero(ub.s)) {
        union_float64 up;
        bool prod_sign;

        prod_sign = float64_is_neg(ua.s) ^ float64_is_neg(ub.s);
        prod_sign ^= !!(flags & float_muladd_negate_product);
        up.s = float64_set_sign(float64_zero, prod_sign);

        if (flags & float_muladd_negate_c) {
            uc.h = -uc.h;
        }
        ur.h = up.h + uc.h;
    } else {
        union_float64 ua_orig = ua;
        union_float64 uc_orig = uc;

        if (flags & float_muladd_negate_product) {
            ua.h = -ua.h;
        }
        if (flags & float_muladd_negate_c) {
            uc.h = -uc.h;
        }

        ur.h = fma(ua.h, ub.h, uc.h);

        if (unlikely(f64_is_inf(ur))) {
            s->float_exception_flags |= float_flag_overflow;
        } else if (unlikely(fabs(ur.h) <= FLT_MIN)) {
            ua = ua_orig;
            uc = uc_orig;
            goto soft;
        }
    }
    if (flags & float_muladd_negate_result) {
        return float64_chs(ur.s);
    }
    return ur.s;

 soft:
    return soft_f64_muladd(ua.s, ub.s, uc.s, flags, s);
}